

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void glfwSwapInterval(int interval)

{
  void *pvVar1;
  undefined4 in_EDI;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    pvVar1 = _glfwPlatformGetTls((_GLFWtls *)0x1e45b9);
    if (pvVar1 == (void *)0x0) {
      _glfwInputError(0x10002,
                      "Cannot set swap interval without a current OpenGL or OpenGL ES context");
    }
    else {
      (**(code **)((long)pvVar1 + 0x248))(in_EDI);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSwapInterval(int interval)
{
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT();

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot set swap interval without a current OpenGL or OpenGL ES context");
        return;
    }

    window->context.swapInterval(interval);
}